

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpeg2StreamReader.cpp
# Opt level: O3

int __thiscall MPEG2StreamReader::intDecodeNAL(MPEG2StreamReader *this,uint8_t *buff)

{
  byte bVar1;
  int iVar2;
  byte *pbVar3;
  long lVar4;
  byte *pbVar5;
  byte *pbVar6;
  
  bVar1 = *buff;
  iVar2 = 0;
  if (bVar1 < 0xb5) {
    if (bVar1 == 0) {
      iVar2 = decodePicture(this,buff);
    }
    else {
      iVar2 = 0;
      if ((bVar1 == 0xb3) && (iVar2 = processSeqStartCode(this,buff), iVar2 == 0)) {
        pbVar3 = (this->super_MPEGStreamReader).super_AbstractStreamReader.m_bufEnd;
        for (pbVar6 = buff + 2; pbVar5 = pbVar3, pbVar6 < pbVar3; pbVar6 = pbVar6 + lVar4) {
          lVar4 = 3;
          if (*pbVar6 < 2) {
            if (*pbVar6 == 0) {
              lVar4 = 1;
            }
            else if ((pbVar6[-2] == 0) && (pbVar6[-1] == 0)) {
              pbVar5 = pbVar6 + -2;
              break;
            }
          }
        }
LAB_001bc01f:
        pbVar6 = pbVar5 + 3;
        if (pbVar6 < pbVar3) {
          bVar1 = pbVar5[3];
          if (bVar1 == 0xb5) {
            iVar2 = processExtStartCode(this,pbVar6);
            if (iVar2 != 0) {
              return iVar2;
            }
            pbVar3 = (this->super_MPEGStreamReader).super_AbstractStreamReader.m_bufEnd;
          }
          else if (bVar1 == 0xb8) {
            *(undefined8 *)&(this->super_MPEGStreamReader).field_0xdc = 0xffffffffffffffff;
          }
          else if (bVar1 == 0) {
            iVar2 = decodePicture(this,pbVar6);
            if (iVar2 != 0) {
              return iVar2;
            }
            (this->super_MPEGStreamReader).m_lastDecodedPos = pbVar6;
            return 0;
          }
          for (pbVar6 = pbVar5 + 5; pbVar5 = pbVar3, pbVar6 < pbVar3; pbVar6 = pbVar6 + lVar4) {
            lVar4 = 3;
            if (*pbVar6 < 2) {
              if (*pbVar6 == 0) {
                lVar4 = 1;
              }
              else if ((pbVar6[-2] == 0) && (pbVar6[-1] == 0)) {
                pbVar5 = pbVar6 + -2;
                break;
              }
            }
          }
          goto LAB_001bc01f;
        }
        iVar2 = -10;
      }
    }
  }
  else if (bVar1 == 0xb5) {
    iVar2 = processExtStartCode(this,buff);
  }
  else if (bVar1 == 0xb8) {
    *(undefined8 *)&(this->super_MPEGStreamReader).field_0xdc = 0xffffffffffffffff;
  }
  return iVar2;
}

Assistant:

int MPEG2StreamReader::intDecodeNAL(uint8_t* buff)
{
    try
    {
        int rez;
        uint8_t* nextNal;
        switch (*buff)
        {
        case SEQ_START_SHORT_CODE:
            rez = processSeqStartCode(buff);
            if (rez != 0)
                return rez;
            nextNal = MPEGHeader::findNextMarker(buff, m_bufEnd) + 3;
            while (true)
            {
                if (nextNal >= m_bufEnd)
                    return NOT_ENOUGH_BUFFER;
                switch (*nextNal)
                {
                case EXT_START_SHORT_CODE:
                    rez = processExtStartCode(nextNal);
                    if (rez != 0)
                        return rez;
                    break;
                case GOP_START_SHORT_CODE:
                    m_framesAtGop = -1;
                    m_lastRef = -1;
                    break;
                case PICTURE_START_SHORT_CODE:
                    rez = decodePicture(nextNal);
                    if (rez == 0)
                    {
                        m_lastDecodedPos = nextNal;
                    }
                    return rez;
                default:;
                }
                nextNal = MPEGHeader::findNextMarker(nextNal, m_bufEnd) + 3;
            }
        case EXT_START_SHORT_CODE:
            return processExtStartCode(buff);
        case GOP_START_SHORT_CODE:
            m_framesAtGop = -1;
            m_lastRef = -1;
            break;
        case PICTURE_START_SHORT_CODE:
            rez = decodePicture(buff);
            return rez;
        default:;
        }
        return 0;
    }
    catch (BitStreamException& e)
    {
        (void)e;
        return NOT_ENOUGH_BUFFER;
    }
}